

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MMDPmxParser.cpp
# Opt level: O2

void __thiscall pmx::PmxMorph::Read(PmxMorph *this,istream *stream,PmxSetting *setting)

{
  int *piVar1;
  PmxMorphUVOffset *pPVar2;
  PmxMorphBoneOffset *pPVar3;
  PmxMorphGroupOffset *pPVar4;
  PmxMorphVertexOffset *pPVar5;
  PmxMorphMaterialOffset *pPVar6;
  _Alloc_hider _Var7;
  DeadlyImportError *this_00;
  uint8_t in_CL;
  int i;
  long lVar8;
  long lVar9;
  allocator<char> local_51;
  string local_50;
  
  ReadString_abi_cxx11_(&local_50,(pmx *)stream,(istream *)(ulong)setting->encoding,in_CL);
  std::__cxx11::string::operator=((string *)this,(string *)&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  ReadString_abi_cxx11_(&local_50,(pmx *)stream,(istream *)(ulong)setting->encoding,in_CL);
  std::__cxx11::string::operator=((string *)&this->morph_english_name,(string *)&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::istream::read((char *)stream,(long)&this->category);
  std::istream::read((char *)stream,(long)&this->morph_type);
  piVar1 = &this->offset_count;
  std::istream::read((char *)stream,(long)piVar1);
  switch(this->morph_type) {
  case Group:
    mmd::make_unique<pmx::PmxMorphGroupOffset[]>((mmd *)&local_50,(long)this->offset_count);
    _Var7._M_p = local_50._M_dataplus._M_p;
    local_50._M_dataplus._M_p = (pointer)0x0;
    std::__uniq_ptr_impl<pmx::PmxMorphGroupOffset,_std::default_delete<pmx::PmxMorphGroupOffset[]>_>
    ::reset((__uniq_ptr_impl<pmx::PmxMorphGroupOffset,_std::default_delete<pmx::PmxMorphGroupOffset[]>_>
             *)&this->group_offsets,(pointer)_Var7._M_p);
    std::unique_ptr<pmx::PmxMorphGroupOffset[],_std::default_delete<pmx::PmxMorphGroupOffset[]>_>::
    ~unique_ptr((unique_ptr<pmx::PmxMorphGroupOffset[],_std::default_delete<pmx::PmxMorphGroupOffset[]>_>
                 *)&local_50);
    lVar9 = 0;
    for (lVar8 = 0; lVar8 < *piVar1; lVar8 = lVar8 + 1) {
      pPVar4 = (this->group_offsets)._M_t.
               super___uniq_ptr_impl<pmx::PmxMorphGroupOffset,_std::default_delete<pmx::PmxMorphGroupOffset[]>_>
               ._M_t.
               super__Tuple_impl<0UL,_pmx::PmxMorphGroupOffset_*,_std::default_delete<pmx::PmxMorphGroupOffset[]>_>
               .super__Head_base<0UL,_pmx::PmxMorphGroupOffset_*,_false>._M_head_impl;
      (*(code *)**(undefined8 **)
                  ((long)&(pPVar4->super_PmxMorphOffset)._vptr_PmxMorphOffset + lVar9))
                ((long)&(pPVar4->super_PmxMorphOffset)._vptr_PmxMorphOffset + lVar9,stream,setting);
      lVar9 = lVar9 + 0x10;
    }
    break;
  case Vertex:
    mmd::make_unique<pmx::PmxMorphVertexOffset[]>((mmd *)&local_50,(long)this->offset_count);
    _Var7._M_p = local_50._M_dataplus._M_p;
    local_50._M_dataplus._M_p = (pointer)0x0;
    std::
    __uniq_ptr_impl<pmx::PmxMorphVertexOffset,_std::default_delete<pmx::PmxMorphVertexOffset[]>_>::
    reset((__uniq_ptr_impl<pmx::PmxMorphVertexOffset,_std::default_delete<pmx::PmxMorphVertexOffset[]>_>
           *)&this->vertex_offsets,(pointer)_Var7._M_p);
    std::unique_ptr<pmx::PmxMorphVertexOffset[],_std::default_delete<pmx::PmxMorphVertexOffset[]>_>
    ::~unique_ptr((unique_ptr<pmx::PmxMorphVertexOffset[],_std::default_delete<pmx::PmxMorphVertexOffset[]>_>
                   *)&local_50);
    lVar9 = 0;
    for (lVar8 = 0; lVar8 < *piVar1; lVar8 = lVar8 + 1) {
      pPVar5 = (this->vertex_offsets)._M_t.
               super___uniq_ptr_impl<pmx::PmxMorphVertexOffset,_std::default_delete<pmx::PmxMorphVertexOffset[]>_>
               ._M_t.
               super__Tuple_impl<0UL,_pmx::PmxMorphVertexOffset_*,_std::default_delete<pmx::PmxMorphVertexOffset[]>_>
               .super__Head_base<0UL,_pmx::PmxMorphVertexOffset_*,_false>._M_head_impl;
      (*(code *)**(undefined8 **)((long)pPVar5->position_offset + lVar9 + -0xc))
                ((long)pPVar5->position_offset + lVar9 + -0xc,stream,setting);
      lVar9 = lVar9 + 0x18;
    }
    break;
  case Bone:
    mmd::make_unique<pmx::PmxMorphBoneOffset[]>((mmd *)&local_50,(long)this->offset_count);
    _Var7._M_p = local_50._M_dataplus._M_p;
    local_50._M_dataplus._M_p = (pointer)0x0;
    std::__uniq_ptr_impl<pmx::PmxMorphBoneOffset,_std::default_delete<pmx::PmxMorphBoneOffset[]>_>::
    reset((__uniq_ptr_impl<pmx::PmxMorphBoneOffset,_std::default_delete<pmx::PmxMorphBoneOffset[]>_>
           *)&this->bone_offsets,(pointer)_Var7._M_p);
    std::unique_ptr<pmx::PmxMorphBoneOffset[],_std::default_delete<pmx::PmxMorphBoneOffset[]>_>::
    ~unique_ptr((unique_ptr<pmx::PmxMorphBoneOffset[],_std::default_delete<pmx::PmxMorphBoneOffset[]>_>
                 *)&local_50);
    lVar9 = 0;
    for (lVar8 = 0; lVar8 < *piVar1; lVar8 = lVar8 + 1) {
      pPVar3 = (this->bone_offsets)._M_t.
               super___uniq_ptr_impl<pmx::PmxMorphBoneOffset,_std::default_delete<pmx::PmxMorphBoneOffset[]>_>
               ._M_t.
               super__Tuple_impl<0UL,_pmx::PmxMorphBoneOffset_*,_std::default_delete<pmx::PmxMorphBoneOffset[]>_>
               .super__Head_base<0UL,_pmx::PmxMorphBoneOffset_*,_false>._M_head_impl;
      (*(code *)**(undefined8 **)((long)pPVar3->translation + lVar9 + -0xc))
                ((long)pPVar3->translation + lVar9 + -0xc,stream,setting);
      lVar9 = lVar9 + 0x28;
    }
    break;
  case UV:
  case AdditionalUV1:
  case AdditionalUV2:
  case AdditionalUV3:
  case AdditionalUV4:
    mmd::make_unique<pmx::PmxMorphUVOffset[]>((mmd *)&local_50,(long)this->offset_count);
    _Var7._M_p = local_50._M_dataplus._M_p;
    local_50._M_dataplus._M_p = (pointer)0x0;
    std::__uniq_ptr_impl<pmx::PmxMorphUVOffset,_std::default_delete<pmx::PmxMorphUVOffset[]>_>::
    reset((__uniq_ptr_impl<pmx::PmxMorphUVOffset,_std::default_delete<pmx::PmxMorphUVOffset[]>_> *)
          &this->uv_offsets,(pointer)_Var7._M_p);
    std::unique_ptr<pmx::PmxMorphUVOffset[],_std::default_delete<pmx::PmxMorphUVOffset[]>_>::
    ~unique_ptr((unique_ptr<pmx::PmxMorphUVOffset[],_std::default_delete<pmx::PmxMorphUVOffset[]>_>
                 *)&local_50);
    lVar9 = 0;
    for (lVar8 = 0; lVar8 < *piVar1; lVar8 = lVar8 + 1) {
      pPVar2 = (this->uv_offsets)._M_t.
               super___uniq_ptr_impl<pmx::PmxMorphUVOffset,_std::default_delete<pmx::PmxMorphUVOffset[]>_>
               ._M_t.
               super__Tuple_impl<0UL,_pmx::PmxMorphUVOffset_*,_std::default_delete<pmx::PmxMorphUVOffset[]>_>
               .super__Head_base<0UL,_pmx::PmxMorphUVOffset_*,_false>._M_head_impl;
      (*(code *)**(undefined8 **)((long)pPVar2->uv_offset + lVar9 + -0xc))
                ((long)pPVar2->uv_offset + lVar9 + -0xc,stream,setting);
      lVar9 = lVar9 + 0x20;
    }
    break;
  case Matrial:
    mmd::make_unique<pmx::PmxMorphMaterialOffset[]>((mmd *)&local_50,(long)this->offset_count);
    _Var7._M_p = local_50._M_dataplus._M_p;
    local_50._M_dataplus._M_p = (pointer)0x0;
    std::
    __uniq_ptr_impl<pmx::PmxMorphMaterialOffset,_std::default_delete<pmx::PmxMorphMaterialOffset[]>_>
    ::reset((__uniq_ptr_impl<pmx::PmxMorphMaterialOffset,_std::default_delete<pmx::PmxMorphMaterialOffset[]>_>
             *)&this->material_offsets,(pointer)_Var7._M_p);
    std::
    unique_ptr<pmx::PmxMorphMaterialOffset[],_std::default_delete<pmx::PmxMorphMaterialOffset[]>_>::
    ~unique_ptr((unique_ptr<pmx::PmxMorphMaterialOffset[],_std::default_delete<pmx::PmxMorphMaterialOffset[]>_>
                 *)&local_50);
    lVar9 = 0;
    for (lVar8 = 0; lVar8 < *piVar1; lVar8 = lVar8 + 1) {
      pPVar6 = (this->material_offsets)._M_t.
               super___uniq_ptr_impl<pmx::PmxMorphMaterialOffset,_std::default_delete<pmx::PmxMorphMaterialOffset[]>_>
               ._M_t.
               super__Tuple_impl<0UL,_pmx::PmxMorphMaterialOffset_*,_std::default_delete<pmx::PmxMorphMaterialOffset[]>_>
               .super__Head_base<0UL,_pmx::PmxMorphMaterialOffset_*,_false>._M_head_impl;
      (*(code *)**(undefined8 **)((long)pPVar6->diffuse + lVar9 + -0x10))
                ((long)pPVar6->diffuse + lVar9 + -0x10,stream,setting);
      lVar9 = lVar9 + 0x80;
    }
    break;
  default:
    this_00 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_50,"MMD: unknown morth type",&local_51);
    DeadlyImportError::DeadlyImportError(this_00,&local_50);
    __cxa_throw(this_00,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  return;
}

Assistant:

void PmxMorph::Read(std::istream *stream, PmxSetting *setting)
	{
		this->morph_name = ReadString(stream, setting->encoding);
		this->morph_english_name = ReadString(stream, setting->encoding);
		stream->read((char*) &category, sizeof(MorphCategory));
		stream->read((char*) &morph_type, sizeof(MorphType));
		stream->read((char*) &this->offset_count, sizeof(int));
		switch (this->morph_type)
		{
		case MorphType::Group:
			group_offsets = mmd::make_unique<PmxMorphGroupOffset []>(this->offset_count);
			for (int i = 0; i < offset_count; i++)
			{
				group_offsets[i].Read(stream, setting);
			}
			break;
		case MorphType::Vertex:
			vertex_offsets = mmd::make_unique<PmxMorphVertexOffset []>(this->offset_count);
			for (int i = 0; i < offset_count; i++)
			{
				vertex_offsets[i].Read(stream, setting);
			}
			break;
		case MorphType::Bone:
			bone_offsets = mmd::make_unique<PmxMorphBoneOffset []>(this->offset_count);
			for (int i = 0; i < offset_count; i++)
			{
				bone_offsets[i].Read(stream, setting);
			}
			break;
		case MorphType::Matrial:
			material_offsets = mmd::make_unique<PmxMorphMaterialOffset []>(this->offset_count);
			for (int i = 0; i < offset_count; i++)
			{
				material_offsets[i].Read(stream, setting);
			}
			break;
		case MorphType::UV:
		case MorphType::AdditionalUV1:
		case MorphType::AdditionalUV2:
		case MorphType::AdditionalUV3:
		case MorphType::AdditionalUV4:
			uv_offsets = mmd::make_unique<PmxMorphUVOffset []>(this->offset_count);
			for (int i = 0; i < offset_count; i++)
			{
				uv_offsets[i].Read(stream, setting);
			}
			break;
		default:
            throw DeadlyImportError("MMD: unknown morth type");
		}
	}